

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O0

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  float fVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  int i_2;
  float b;
  float a;
  float beta;
  float gamma;
  float var;
  int i_1;
  float tmp;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int q;
  int size;
  int h;
  int w;
  float in_stack_ffffffffffffff34;
  Mat *this_00;
  int local_ac;
  int local_94;
  int local_88;
  float local_84;
  float local_80;
  Mat local_70;
  float *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = local_1c * local_20;
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0xb8); local_28 = local_28 + 1) {
    this_00 = &local_70;
    ncnn::Mat::channel(this_00,(int)in_stack_ffffffffffffff34);
    pfVar1 = ncnn::Mat::operator_cast_to_float_(this_00);
    ncnn::Mat::~Mat((Mat *)0x1fadc2);
    local_80 = 0.0;
    local_84 = 0.0;
    for (local_88 = 0; local_88 < local_24; local_88 = local_88 + 1) {
      local_80 = pfVar1[local_88] + local_80;
    }
    fVar4 = (float)local_24;
    for (local_94 = 0; local_94 < local_24; local_94 = local_94 + 1) {
      fVar2 = pfVar1[local_94] - local_80 / fVar4;
      local_84 = fVar2 * fVar2 + local_84;
    }
    fVar5 = (float)local_24;
    local_30 = pfVar1;
    pfVar1 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xc0),(long)local_28);
    in_stack_ffffffffffffff34 = *pfVar1;
    pfVar1 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x100),(long)local_28);
    fVar2 = *pfVar1;
    dVar3 = std::sqrt((double)(ulong)(uint)(local_84 / fVar5 + *(float *)(in_RDI + 0xbc)));
    fVar5 = in_stack_ffffffffffffff34 / SUB84(dVar3,0);
    for (local_ac = 0; local_ac < local_24; local_ac = local_ac + 1) {
      local_30[local_ac] = local_30[local_ac] * fVar5 + -(local_80 / fVar4) * fVar5 + fVar2;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i=0; i<size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = static_cast<float>(gamma / (sqrt(var + eps)));
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}